

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

void __thiscall
ScriptTest::DoTest(ScriptTest *this,CScript *scriptPubKey,CScript *scriptSig,
                  CScriptWitness *scriptWitness,uint32_t flags,string *message,int scriptError,
                  CAmount nValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint64_t uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  uint flags_00;
  undefined8 uVar7;
  undefined4 in_register_00000084;
  iterator pvVar8;
  iterator pvVar9;
  int iVar10;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  CMutableTransaction tx2;
  CMutableTransaction tx;
  ScriptError err;
  uint32_t combined_flags;
  CTransaction txCredit;
  string *psVar11;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  assertion_result local_280;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 local_238 [16];
  undefined1 *local_228;
  lazy_ostream *local_220;
  undefined8 local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  vector<CTxIn,_std::allocator<CTxIn>_> local_1f0;
  vector<CTxOut,_std::allocator<CTxOut>_> local_1d8;
  uint32_t local_1c0;
  uint32_t uStack_1bc;
  CMutableTransaction local_1b8;
  ScriptError_t local_17c;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  lazy_ostream local_d8;
  _func_int *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_c0;
  CTransaction local_b8;
  long local_38;
  
  pvVar8 = (iterator)CONCAT44(in_register_00000084,flags);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  flags_00 = flags | 0x801;
  if ((flags >> 8 & 1) == 0) {
    flags_00 = flags;
  }
  psVar11 = message;
  BuildCreditingTransaction(&local_1b8,scriptPubKey,(int)nValue);
  CTransaction::CTransaction(&local_b8,&local_1b8);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_1b8.vin);
  BuildSpendingTransaction(&local_1b8,scriptSig,scriptWitness,&local_b8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector(&local_1f0,&local_1b8.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector(&local_1d8,&local_1b8.vout);
  local_1c0 = local_1b8.version;
  uStack_1bc = local_1b8.nLockTime;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x7f;
  file.m_begin = (iterator)&local_200;
  msg.m_end = (iterator)message;
  msg.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_210,msg);
  local_238._0_8_ = &PTR_CheckECDSASignature_0138b590;
  local_238._8_8_ = &local_1b8;
  local_228 = (undefined1 *)0x0;
  local_220 = (lazy_ostream *)
              (local_b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start)->nValue;
  local_218 = 0;
  bVar2 = VerifyScript(scriptSig,scriptPubKey,scriptWitness,flags_00,
                       (BaseSignatureChecker *)local_238,&local_17c);
  local_f8._M_dataplus._M_p._0_1_ = (scriptError == 0) == bVar2;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
  local_c8 = (_func_int *)boost::unit_test::lazy_ostream::inst;
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_240 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  pbStack_c0 = psVar11;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_f8,&local_d8,1,1,WARN,(check_type)psVar11,(size_t)&local_248
             ,0x7f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_f8.field_2._M_allocated_capacity);
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x80;
  file_00.m_begin = (iterator)&local_258;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_268,
             msg_00);
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_17c == scriptError);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  FormatScriptError_abi_cxx11_(&local_158,local_17c);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158," where ");
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == paVar5) {
    local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_138._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_138._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  FormatScriptError_abi_cxx11_(&local_178,scriptError);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    uVar7 = local_138.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < local_138._M_string_length + local_178._M_string_length) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      uVar7 = local_178.field_2._M_allocated_capacity;
    }
    if (local_138._M_string_length + local_178._M_string_length <= (ulong)uVar7) {
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_178,0,0,local_138._M_dataplus._M_p,local_138._M_string_length);
      goto LAB_005ff08f;
    }
  }
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_138,local_178._M_dataplus._M_p,local_178._M_string_length);
LAB_005ff08f:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar6 == paVar5) {
    local_118.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_118.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_118.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_118._M_dataplus._M_p = (pointer)paVar6;
  }
  local_118._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_118," expected: ");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar6 = &pbVar3->field_2;
  if (paVar5 == paVar6) {
    local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar5;
  }
  local_f8._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_f8,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
  local_d8._vptr_lazy_ostream = (_func_int **)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._vptr_lazy_ostream == paVar5) {
    local_c8 = (_func_int *)paVar5->_M_allocated_capacity;
    pbStack_c0 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&pbVar3->field_2 + 8);
    local_d8._vptr_lazy_ostream = &local_c8;
  }
  else {
    local_c8 = (_func_int *)paVar5->_M_allocated_capacity;
  }
  local_d8._8_8_ = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  local_238._8_8_ = local_238._8_8_ & 0xffffffffffffff00;
  local_238._0_8_ = &PTR__lazy_ostream_01388e08;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_220 = &local_d8;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_288 = "";
  pvVar8 = (iterator)0x1;
  pvVar9 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_280,(lazy_ostream *)local_238,1,1,WARN,(check_type)psVar11,(size_t)&local_290,
             0x80);
  if (local_d8._vptr_lazy_ostream != &local_c8) {
    operator_delete(local_d8._vptr_lazy_ostream,(ulong)(local_c8 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_158._M_dataplus._M_p._4_4_,(uint)local_158._M_dataplus._M_p) !=
      &local_158.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_158._M_dataplus._M_p._4_4_,(uint)local_158._M_dataplus._M_p),
                    local_158.field_2._M_allocated_capacity + 1);
  }
  boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
  iVar10 = 0x10;
  do {
    uVar4 = RandomMixin<FastRandomContext>::randbits
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       0x10);
    local_158._M_dataplus._M_p._0_4_ = ~(uint)uVar4 & flags_00;
    if (scriptError != 0) {
      local_158._M_dataplus._M_p._0_4_ = flags_00 | (uint)uVar4;
    }
    if ((((uint)local_158._M_dataplus._M_p & 0x801) != 0x800) &&
       (((byte)((uint)local_158._M_dataplus._M_p >> 8) &
        ((uint)local_158._M_dataplus._M_p & 0x801) != 0x801) == 0)) {
      local_2a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_298 = "";
      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x89;
      file_01.m_begin = (iterator)&local_2a0;
      msg_01.m_end = pvVar9;
      msg_01.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2b0,
                 msg_01);
      local_238._0_8_ = &PTR_CheckECDSASignature_0138b590;
      local_238._8_8_ = &local_1b8;
      local_228 = (undefined1 *)0x0;
      local_220 = (lazy_ostream *)
                  (local_b8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start)->nValue;
      local_218 = 0;
      bVar2 = VerifyScript(scriptSig,scriptPubKey,scriptWitness,(uint)local_158._M_dataplus._M_p,
                           (BaseSignatureChecker *)local_238,&local_17c);
      local_138._M_dataplus._M_p._0_1_ = (scriptError == 0) == bVar2;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      tinyformat::format<unsigned_int>(&local_118," (with flags %x)",(uint *)&local_158);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_118,0,0,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if (paVar1 == paVar5) {
        local_f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      }
      else {
        local_f8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_f8._M_dataplus._M_p = (pointer)paVar1;
      }
      local_f8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
      local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388e08;
      local_c8 = (_func_int *)boost::unit_test::lazy_ostream::inst;
      pbStack_c0 = &local_f8;
      local_2c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_2b8 = "";
      pvVar8 = (iterator)0x1;
      pvVar9 = (iterator)0x1;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_138,&local_d8,1,1,WARN,(check_type)psVar11,
                 (size_t)&local_2c0,0x89);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_138.field_2._M_allocated_capacity);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1d8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_1f0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_1b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_1b8.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_b8.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DoTest(const CScript& scriptPubKey, const CScript& scriptSig, const CScriptWitness& scriptWitness, uint32_t flags, const std::string& message, int scriptError, CAmount nValue = 0)
{
    bool expect = (scriptError == SCRIPT_ERR_OK);
    if (flags & SCRIPT_VERIFY_CLEANSTACK) {
        flags |= SCRIPT_VERIFY_P2SH;
        flags |= SCRIPT_VERIFY_WITNESS;
    }
    ScriptError err;
    const CTransaction txCredit{BuildCreditingTransaction(scriptPubKey, nValue)};
    CMutableTransaction tx = BuildSpendingTransaction(scriptSig, scriptWitness, txCredit);
    CMutableTransaction tx2 = tx;
    BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message);
    BOOST_CHECK_MESSAGE(err == scriptError, FormatScriptError(err) + " where " + FormatScriptError((ScriptError_t)scriptError) + " expected: " + message);

    // Verify that removing flags from a passing test or adding flags to a failing test does not change the result.
    for (int i = 0; i < 16; ++i) {
        uint32_t extra_flags(m_rng.randbits(16));
        uint32_t combined_flags{expect ? (flags & ~extra_flags) : (flags | extra_flags)};
        // Weed out some invalid flag combinations.
        if (combined_flags & SCRIPT_VERIFY_CLEANSTACK && ~combined_flags & (SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS)) continue;
        if (combined_flags & SCRIPT_VERIFY_WITNESS && ~combined_flags & SCRIPT_VERIFY_P2SH) continue;
        BOOST_CHECK_MESSAGE(VerifyScript(scriptSig, scriptPubKey, &scriptWitness, combined_flags, MutableTransactionSignatureChecker(&tx, 0, txCredit.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err) == expect, message + strprintf(" (with flags %x)", combined_flags));
    }
}